

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_command_buffer_khr
clCreateCommandBufferKHR
          (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_properties_khr *properties,
          cl_int *errcode_ret)

{
  CTracker *pCVar1;
  bool bVar2;
  CLIntercept *this;
  byte bVar3;
  CLdispatchX *pCVar4;
  cl_command_buffer_khr cmdbuf;
  time_point end;
  allocator local_b1;
  time_point local_b0;
  cl_int localErrorCode;
  __int_type local_a0;
  cl_command_queue local_98;
  string local_90;
  string propsStr;
  string queueList;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
LAB_001385df:
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x1e;
    }
    return (cl_command_buffer_khr)0x0;
  }
  if (queues == (cl_command_queue *)0x0 || num_queues == 0) {
    local_98 = (cl_command_queue)0x0;
  }
  else {
    local_98 = *queues;
  }
  pCVar4 = CLIntercept::dispatchX(g_pIntercept,local_98);
  if (pCVar4->clCreateCommandBufferKHR ==
      (_func_cl_command_buffer_khr_cl_uint_cl_command_queue_ptr_cl_command_buffer_properties_khr_ptr_cl_int_ptr
       *)0x0) goto LAB_001385df;
  local_a0 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  queueList._M_dataplus._M_p = (pointer)&queueList.field_2;
  queueList._M_string_length = 0;
  propsStr._M_dataplus._M_p = (pointer)&propsStr.field_2;
  propsStr._M_string_length = 0;
  queueList.field_2._M_local_buf[0] = '\0';
  propsStr.field_2._M_local_buf[0] = '\0';
  bVar3 = (this->m_Config).CallLogging;
  if ((bool)bVar3 == true) {
    CLIntercept::getObjectListString<_cl_command_queue*>(this,num_queues,queues,&queueList);
    CLIntercept::getCommandBufferPropertiesString(this,properties,&propsStr);
    bVar3 = (this->m_Config).CallLogging;
  }
  if ((bVar3 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clCreateCommandBufferKHR",local_a0,(cl_kernel)0x0,
               "queues = %s, properties = [ %s ]",queueList._M_dataplus._M_p,
               propsStr._M_dataplus._M_p);
    bVar3 = (this->m_Config).CallLogging;
  }
  localErrorCode = 0;
  if ((((bVar3 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_001385bc:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_001385bc;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_b0.__d.__r = (duration)0;
  }
  else {
    local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  cmdbuf = (*pCVar4->clCreateCommandBufferKHR)(num_queues,queues,properties,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_a0 &&
        (local_a0 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_90,"",&local_b1);
      CLIntercept::updateHostTimingStats(this,"clCreateCommandBufferKHR",&local_90,local_b0,end);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar3 != false) || ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0))
    goto LAB_001386cc;
  }
  else if (*errcode_ret != 0) {
    CLIntercept::logError(this,"clCreateCommandBufferKHR",*errcode_ret);
    bVar3 = (this->m_Config).ErrorAssert;
LAB_001386cc:
    if ((bVar3 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors == true) {
      *errcode_ret = 0;
    }
  }
  if ((this->m_Config).LeakChecking == true) {
    if (cmdbuf == (cl_command_buffer_khr)0x0) {
LAB_0013871f:
      bVar2 = true;
      goto LAB_00138722;
    }
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_CommandBuffers;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else if (cmdbuf == (cl_command_buffer_khr)0x0) goto LAB_0013871f;
  if ((this->m_Config).DumpCommandBuffers == true) {
    CLIntercept::recordCommandBufferCreate(this,cmdbuf,num_queues,queues);
  }
  bVar2 = false;
LAB_00138722:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateCommandBufferKHR",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0
               ,"returned %p",cmdbuf);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_90,"",&local_b1);
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateCommandBufferKHR",&local_90,false,0,local_b0,end);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (!bVar2) {
    CLIntercept::addCommandBufferInfo(this,cmdbuf,local_98);
  }
  std::__cxx11::string::~string((string *)&propsStr);
  std::__cxx11::string::~string((string *)&queueList);
  return cmdbuf;
}

Assistant:

CL_API_ENTRY cl_command_buffer_khr CL_API_CALL clCreateCommandBufferKHR(
    cl_uint num_queues,
    const cl_command_queue* queues,
    const cl_command_buffer_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        cl_command_queue queue = num_queues && queues ? queues[0] : NULL;
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clCreateCommandBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            std::string queueList;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getObjectListString(
                    num_queues,
                    queues,
                    queueList );
                pIntercept->getCommandBufferPropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "queues = %s, properties = [ %s ]",
                queueList.c_str(),
                propsStr.c_str() );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_command_buffer_khr   retVal = dispatchX.clCreateCommandBufferKHR(
                num_queues,
                queues,
                properties,
                errcode_ret );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            RECORD_COMMAND_BUFFER_CREATE( retVal, num_queues, queues );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addCommandBufferInfo(
                    retVal,
                    queue );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_VALUE);
}